

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  Rep *pRVar2;
  Rep *pRVar3;
  SourceCodeInfo_Location *pSVar4;
  int *piVar5;
  void **ppvVar6;
  
  internal::CheckNotNull<google::protobuf::SourceLocation>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
             ,0xafa,"\'out_location\' must not be NULL",out_location);
  if (((*(SourceCodeInfo **)(this + 0xb0) != (SourceCodeInfo *)0x0) &&
      (pSVar4 = FileDescriptorTables::GetSourceLocation
                          (*(FileDescriptorTables **)(this + 0xa8),path,
                           *(SourceCodeInfo **)(this + 0xb0)),
      pSVar4 != (SourceCodeInfo_Location *)0x0)) &&
     (iVar1 = (pSVar4->span_).current_size_, iVar1 - 3U < 2)) {
    pRVar2 = (pSVar4->span_).rep_;
    out_location->start_line = pRVar2->elements[0];
    out_location->start_column = *(int *)&pRVar2->field_0xc;
    piVar5 = RepeatedField<int>::Get(&pSVar4->span_,(uint)(iVar1 != 3) * 2);
    out_location->end_line = *piVar5;
    piVar5 = RepeatedField<int>::Get(&pSVar4->span_,(pSVar4->span_).current_size_ + -1);
    out_location->end_column = *piVar5;
    std::__cxx11::string::_M_assign((string *)&out_location->leading_comments);
    std::__cxx11::string::_M_assign((string *)&out_location->trailing_comments);
    pRVar3 = (pSVar4->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar6 = (void **)0x0;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &out_location->leading_detached_comments,ppvVar6,
               ppvVar6 + (pSVar4->leading_detached_comments_).super_RepeatedPtrFieldBase.
                         current_size_);
    return true;
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK_NOTNULL(out_location);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
        tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line   = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line     = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column   = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}